

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall Wasm::WasmBytecodeGenerator::EmitExpr(WasmBytecodeGenerator *this,WasmOp op)

{
  FunctionBody *pFVar1;
  WasmType type;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  int iVar5;
  RegSlot RVar6;
  EmitInfo info;
  _func_int **pp_Var7;
  WasmBinaryReader *pWVar8;
  RegisterSpace *this_00;
  WasmCompilationException *this_01;
  ViewType VVar9;
  uint32 *puVar10;
  undefined1 *puVar11;
  WasmType *pWVar12;
  WasmBlock WVar13;
  OpCodeAsmJs OVar14;
  WasmOp WVar15;
  undefined8 uVar16;
  IWasmByteCodeWriter *pIVar17;
  PolymorphicEmitInfo PVar18;
  WasmConstLitNode cnst;
  PolymorphicEmitInfo local_38;
  
  pFVar1 = (this->m_funcInfo->m_body).ptr;
  if (pFVar1 == (FunctionBody *)0x0) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmBytecodePhase);
  }
  else {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar1);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmBytecodePhase,uVar3,LVar4);
  }
  if (bVar2 != false) {
    PrintOpBegin(this,op);
  }
  switch((uint)op) {
  case 0xfe10:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.load");
      break;
    }
    pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
    VVar9 = TYPE_INT32;
    WVar15 = wbI32AtomicLoad;
    goto LAB_00d6db96;
  case 0xfe11:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.load");
      break;
    }
    pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
    VVar9 = TYPE_INT64;
    WVar15 = wbI64AtomicLoad;
    goto LAB_00d6db96;
  case 0xfe12:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.load8_u");
      break;
    }
    pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
    VVar9 = TYPE_UINT8;
    WVar15 = wbI32AtomicLoad8U;
    goto LAB_00d6db96;
  case 0xfe13:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.load16_u");
      break;
    }
    pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
    VVar9 = TYPE_UINT16;
    WVar15 = wbI32AtomicLoad16U;
    goto LAB_00d6db96;
  case 0xfe14:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.load8_u");
      break;
    }
    pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
    VVar9 = TYPE_UINT8_TO_INT64;
    WVar15 = wbI64AtomicLoad8U;
    goto LAB_00d6db96;
  case 0xfe15:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.load16_u");
      break;
    }
    pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
    VVar9 = TYPE_UINT16_TO_INT64;
    WVar15 = wbI64AtomicLoad16U;
    goto LAB_00d6db96;
  case 0xfe16:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.load32_u");
      break;
    }
    pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
    VVar9 = TYPE_UINT32_TO_INT64;
    WVar15 = wbI64AtomicLoad32U;
LAB_00d6db96:
    info = EmitMemAccess<false,true>(this,WVar15,pWVar12,VVar9);
    goto LAB_00d6dbec;
  case 0xfe17:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.store");
      break;
    }
    puVar11 = WasmOpCodeSignatures::I_II;
    VVar9 = TYPE_INT32;
    WVar15 = wbI32AtomicStore;
    goto LAB_00d6dbdd;
  case 0xfe18:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.store");
      break;
    }
    puVar11 = WasmOpCodeSignatures::L_IL;
    VVar9 = TYPE_INT64;
    WVar15 = wbI64AtomicStore;
    goto LAB_00d6dbdd;
  case 0xfe19:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.store8");
      break;
    }
    puVar11 = WasmOpCodeSignatures::I_II;
    WVar15 = wbI32AtomicStore8;
    VVar9 = TYPE_INT8;
    goto LAB_00d6dbdd;
  case 0xfe1a:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.store16");
      break;
    }
    puVar11 = WasmOpCodeSignatures::I_II;
    VVar9 = TYPE_INT16;
    WVar15 = wbI32AtomicStore16;
    goto LAB_00d6dbdd;
  case 0xfe1b:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.store8");
      break;
    }
    puVar11 = WasmOpCodeSignatures::L_IL;
    VVar9 = TYPE_INT8_TO_INT64;
    WVar15 = wbI64AtomicStore8;
    goto LAB_00d6dbdd;
  case 0xfe1c:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.store16");
      break;
    }
    puVar11 = WasmOpCodeSignatures::L_IL;
    VVar9 = TYPE_INT16_TO_INT64;
    WVar15 = wbI64AtomicStore16;
    goto LAB_00d6dbdd;
  case 0xfe1d:
    bVar2 = Threads::IsEnabled();
    if (!bVar2) {
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.store32");
      break;
    }
    puVar11 = WasmOpCodeSignatures::L_IL;
    VVar9 = TYPE_INT32_TO_INT64;
    WVar15 = wbI64AtomicStore32;
LAB_00d6dbdd:
    info = EmitMemAccess<true,true>(this,WVar15,(WasmType *)puVar11,VVar9);
    goto LAB_00d6dbec;
  case 0xfe1e:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.add");
    break;
  case 0xfe1f:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.add");
    break;
  case 0xfe20:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.add");
    break;
  case 0xfe21:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.add");
    break;
  case 0xfe22:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.add");
    break;
  case 0xfe23:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.add");
    break;
  case 0xfe24:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.add");
    break;
  case 0xfe25:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.sub");
    break;
  case 0xfe26:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.sub");
    break;
  case 0xfe27:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.sub");
    break;
  case 0xfe28:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.sub");
    break;
  case 0xfe29:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.sub");
    break;
  case 0xfe2a:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.sub");
    break;
  case 0xfe2b:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.sub");
    break;
  case 0xfe2c:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.and");
    break;
  case 0xfe2d:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.and");
    break;
  case 0xfe2e:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.and");
    break;
  case 0xfe2f:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.and");
    break;
  case 0xfe30:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.and");
    break;
  case 0xfe31:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.and");
    break;
  case 0xfe32:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.and");
    break;
  case 0xfe33:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.or");
    break;
  case 0xfe34:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.or");
    break;
  case 0xfe35:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.or");
    break;
  case 0xfe36:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.or");
    break;
  case 0xfe37:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.or");
    break;
  case 0xfe38:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.or");
    break;
  case 0xfe39:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.or");
    break;
  case 0xfe3a:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.xor");
    break;
  case 0xfe3b:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.xor");
    break;
  case 0xfe3c:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.xor");
    break;
  case 0xfe3d:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.xor");
    break;
  case 0xfe3e:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.xor");
    break;
  case 0xfe3f:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.xor");
    break;
  case 0xfe40:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.xor");
    break;
  case 0xfe41:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.xchg");
    break;
  case 0xfe42:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.xchg");
    break;
  case 0xfe43:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.xchg");
    break;
  case 0xfe44:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.xchg");
    break;
  case 0xfe45:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.xchg");
    break;
  case 0xfe46:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.xchg");
    break;
  case 0xfe47:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.xchg");
    break;
  case 0xfe48:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw.cmpxchg");
    break;
  case 0xfe49:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw.cmpxchg");
    break;
  case 0xfe4a:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw8_u.cmpxchg");
    break;
  case 0xfe4b:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i32.atomic.rmw16_u.cmpxchg");
    break;
  case 0xfe4c:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw8_u.cmpxchg");
    break;
  case 0xfe4d:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw16_u.cmpxchg");
    break;
  case 0xfe4e:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Operator %s is Not Yet Implemented",L"i64.atomic.rmw32_u.cmpxchg");
    break;
  default:
    iVar5 = op - 0xfc00;
    switch(iVar5) {
    case 0:
      bVar2 = WasmNontrapping::IsEnabled();
      if (!bVar2) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.trunc_s:sat/f32");
        goto LAB_00d700b3;
      }
switchD_00d6dd34_caseD_0:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar14 = Conv_Sat_FTI;
      goto LAB_00d6db0d;
    case 1:
      bVar2 = WasmNontrapping::IsEnabled();
      if (!bVar2) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.trunc_u:sat/f32");
        goto LAB_00d700b3;
      }
switchD_00d6dd34_caseD_1:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar14 = Conv_Sat_FTU;
      goto LAB_00d6db0d;
    case 2:
      bVar2 = WasmNontrapping::IsEnabled();
      if (!bVar2) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.trunc_s:sat/f64");
        goto LAB_00d700b3;
      }
switchD_00d6dd34_caseD_2:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_D;
      OVar14 = Conv_Sat_DTI;
      goto LAB_00d6db0d;
    case 3:
      bVar2 = WasmNontrapping::IsEnabled();
      if (!bVar2) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i32.trunc_u:sat/f64");
        goto LAB_00d700b3;
      }
switchD_00d6dd34_caseD_3:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_D;
      OVar14 = Conv_Sat_DTU;
      goto LAB_00d6db0d;
    case 4:
      bVar2 = WasmNontrapping::IsEnabled();
      if (!bVar2) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.trunc_s:sat/f32");
        goto LAB_00d700b3;
      }
switchD_00d6dd34_caseD_4:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_F;
      OVar14 = Conv_Sat_FTL;
      goto LAB_00d6db0d;
    case 5:
      bVar2 = WasmNontrapping::IsEnabled();
      if (!bVar2) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.trunc_u:sat/f32");
        goto LAB_00d700b3;
      }
switchD_00d6dd34_caseD_5:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_F;
      OVar14 = Conv_Sat_FTUL;
      goto LAB_00d6db0d;
    case 6:
      bVar2 = WasmNontrapping::IsEnabled();
      if (!bVar2) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.trunc_s:sat/f64");
        goto LAB_00d700b3;
      }
switchD_00d6dd34_caseD_6:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar14 = Conv_Sat_DTL;
      goto LAB_00d6db0d;
    case 7:
      bVar2 = WasmNontrapping::IsEnabled();
      if (!bVar2) {
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Operator %s is Not Yet Implemented",L"i64.trunc_u:sat/f64");
        goto LAB_00d700b3;
      }
switchD_00d6dd34_caseD_7:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar14 = Conv_Sat_DTUL;
      goto LAB_00d6db0d;
    default:
      switch(op) {
      case wbI32Extend8_s:
        bVar2 = SignExtends::IsEnabled();
        if (!bVar2) {
          this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
          WasmCompilationException::WasmCompilationException
                    (this_01,L"Operator %s is Not Yet Implemented",L"i32.extend8_s");
          goto LAB_00d700b3;
        }
switchD_00d6dc8c_caseD_c0:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
        OVar14 = I32Extend8_s;
        goto LAB_00d6db0d;
      case wbI32Extend16_s:
        bVar2 = SignExtends::IsEnabled();
        if (!bVar2) {
          this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
          WasmCompilationException::WasmCompilationException
                    (this_01,L"Operator %s is Not Yet Implemented",L"i32.extend16_s");
          goto LAB_00d700b3;
        }
switchD_00d6dc8c_caseD_c1:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
        OVar14 = I32Extend16_s;
        goto LAB_00d6db0d;
      case wbI64Extend8_s:
        bVar2 = SignExtends::IsEnabled();
        if (!bVar2) {
          this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
          WasmCompilationException::WasmCompilationException
                    (this_01,L"Operator %s is Not Yet Implemented",L"i64.extend8_s");
          goto LAB_00d700b3;
        }
switchD_00d6dc8c_caseD_c2:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_L;
        OVar14 = I64Extend8_s;
        goto LAB_00d6db0d;
      case wbI64Extend16_s:
        bVar2 = SignExtends::IsEnabled();
        if (!bVar2) {
          this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
          WasmCompilationException::WasmCompilationException
                    (this_01,L"Operator %s is Not Yet Implemented",L"i64.extend16_s");
          goto LAB_00d700b3;
        }
switchD_00d6dc8c_caseD_c3:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_L;
        OVar14 = I64Extend16_s;
        goto LAB_00d6db0d;
      case wbI64Extend32_s:
        bVar2 = SignExtends::IsEnabled();
        if (!bVar2) {
          this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
          WasmCompilationException::WasmCompilationException
                    (this_01,L"Operator %s is Not Yet Implemented",L"i64.extend32_s");
          goto LAB_00d700b3;
        }
switchD_00d6dc8c_caseD_c4:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_L;
        OVar14 = I64Extend32_s;
        goto LAB_00d6db0d;
      }
    }
    switch((ulong)op) {
    case 0:
      (*this->m_writer->_vptr_IWasmByteCodeWriter[7])(this->m_writer,0x10b);
      SetUnreachableState(this,true);
      goto LAB_00d6df1e;
    case 1:
      goto switchD_00d6dc8c_caseD_1;
    case 2:
      PVar18 = EmitBlock(this);
      goto LAB_00d6f4d6;
    case 3:
      PVar18 = EmitLoop(this);
      goto LAB_00d6f4d6;
    case 4:
      PVar18 = EmitIfElseExpr(this);
      goto LAB_00d6f4d6;
    case 5:
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException(this_01,L"Unexpected else opcode");
      goto LAB_00d700b3;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x25:
    case 0x26:
    case 0x27:
      goto switchD_00d6dc8c_caseD_6;
    case 0xb:
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException(this_01,L"Unexpected end opcode");
      goto LAB_00d700b3;
    case 0xc:
      EmitBr(this);
      goto LAB_00d6df1e;
    case 0xd:
      PVar18 = EmitBrIf(this);
      goto LAB_00d6f4d6;
    case 0xe:
      EmitBrTable(this);
      goto LAB_00d6df1e;
    case 0xf:
      EmitReturnExpr(this,(PolymorphicEmitInfo *)0x0);
LAB_00d6df1e:
      info.super_EmitInfoBase.location = 0xffffffff;
      info.type = Any;
      goto LAB_00d6dbec;
    case 0x10:
      PVar18 = EmitCall<(Wasm::WasmOp)16>(this);
      goto LAB_00d6f4d6;
    case 0x11:
      PVar18 = EmitCall<(Wasm::WasmOp)17>(this);
LAB_00d6f4d6:
      local_38.field_1 = PVar18.field_1;
      local_38.count = PVar18.count;
      goto LAB_00d6dbf8;
    case 0x1a:
      info = EmitDrop(this);
      goto LAB_00d6dbec;
    case 0x1b:
      info = EmitSelect(this);
      goto LAB_00d6dbec;
    case 0x20:
      info = EmitGetLocal(this);
      goto LAB_00d6dbec;
    case 0x21:
      bVar2 = false;
      goto LAB_00d6e006;
    case 0x22:
      bVar2 = true;
LAB_00d6e006:
      info = EmitSetLocal(this,bVar2);
      goto LAB_00d6dbec;
    case 0x23:
      info = EmitGetGlobal(this);
      goto LAB_00d6dbec;
    case 0x24:
      info = EmitSetGlobal(this);
      goto LAB_00d6dbec;
    case 0x28:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar15 = wbI32LoadMem;
      VVar9 = TYPE_INT32;
      goto LAB_00d6f3c1;
    case 0x29:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar15 = wbI64LoadMem;
      VVar9 = TYPE_INT64;
      goto LAB_00d6f3c1;
    case 0x2a:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_I;
      WVar15 = wbF32LoadMem;
      VVar9 = TYPE_FLOAT32;
      goto LAB_00d6f3c1;
    case 0x2b:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_I;
      WVar15 = wbF64LoadMem;
      VVar9 = TYPE_FLOAT64;
      goto LAB_00d6f3c1;
    case 0x2c:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar15 = wbI32LoadMem8S;
      VVar9 = TYPE_INT8;
      goto LAB_00d6f3c1;
    case 0x2d:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar15 = wbI32LoadMem8U;
      VVar9 = TYPE_UINT8;
      goto LAB_00d6f3c1;
    case 0x2e:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar15 = wbI32LoadMem16S;
      VVar9 = TYPE_INT16;
      goto LAB_00d6f3c1;
    case 0x2f:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
      WVar15 = wbI32LoadMem16U;
      VVar9 = TYPE_UINT16;
      goto LAB_00d6f3c1;
    case 0x30:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar15 = wbI64LoadMem8S;
      VVar9 = TYPE_INT8_TO_INT64;
      goto LAB_00d6f3c1;
    case 0x31:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar15 = wbI64LoadMem8U;
      VVar9 = TYPE_UINT8_TO_INT64;
      goto LAB_00d6f3c1;
    case 0x32:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar15 = wbI64LoadMem16S;
      VVar9 = TYPE_INT16_TO_INT64;
      goto LAB_00d6f3c1;
    case 0x33:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar15 = wbI64LoadMem16U;
      VVar9 = TYPE_UINT16_TO_INT64;
      goto LAB_00d6f3c1;
    case 0x34:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar15 = wbI64LoadMem32S;
      VVar9 = TYPE_INT32_TO_INT64;
      goto LAB_00d6f3c1;
    case 0x35:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
      WVar15 = wbI64LoadMem32U;
      VVar9 = TYPE_UINT32_TO_INT64;
LAB_00d6f3c1:
      info = EmitMemAccess<false,false>(this,WVar15,pWVar12,VVar9);
      goto LAB_00d6dbec;
    case 0x36:
      puVar11 = WasmOpCodeSignatures::I_II;
      WVar15 = wbI32StoreMem;
      VVar9 = TYPE_INT32;
      goto LAB_00d6f4a0;
    case 0x37:
      puVar11 = WasmOpCodeSignatures::L_IL;
      WVar15 = wbI64StoreMem;
      VVar9 = TYPE_INT64;
      goto LAB_00d6f4a0;
    case 0x38:
      puVar11 = WasmOpCodeSignatures::F_IF;
      WVar15 = wbF32StoreMem;
      VVar9 = TYPE_FLOAT32;
      goto LAB_00d6f4a0;
    case 0x39:
      puVar11 = WasmOpCodeSignatures::D_ID;
      WVar15 = wbF64StoreMem;
      VVar9 = TYPE_FLOAT64;
      goto LAB_00d6f4a0;
    case 0x3a:
      puVar11 = WasmOpCodeSignatures::I_II;
      WVar15 = wbI32StoreMem8;
      VVar9 = TYPE_INT8;
      goto LAB_00d6f4a0;
    case 0x3b:
      puVar11 = WasmOpCodeSignatures::I_II;
      WVar15 = wbI32StoreMem16;
      VVar9 = TYPE_INT16;
      goto LAB_00d6f4a0;
    case 0x3c:
      puVar11 = WasmOpCodeSignatures::L_IL;
      WVar15 = wbI64StoreMem8;
      VVar9 = TYPE_INT8_TO_INT64;
      goto LAB_00d6f4a0;
    case 0x3d:
      puVar11 = WasmOpCodeSignatures::L_IL;
      WVar15 = wbI64StoreMem16;
      VVar9 = TYPE_INT16_TO_INT64;
      goto LAB_00d6f4a0;
    case 0x3e:
      puVar11 = WasmOpCodeSignatures::L_IL;
      WVar15 = wbI64StoreMem32;
      VVar9 = TYPE_INT32_TO_INT64;
LAB_00d6f4a0:
      info = EmitMemAccess<true,false>(this,WVar15,(WasmType *)puVar11,VVar9);
      goto LAB_00d6dbec;
    case 0x3f:
      SetUsesMemory(this,0);
      this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&this->mTypedRegisterAllocator,INT32);
      RVar6 = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
      PolymorphicEmitInfo::PolymorphicEmitInfo(&local_38,(EmitInfo)((ulong)RVar6 | 0x100000000));
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0xe])(this->m_writer,0x109,(ulong)RVar6);
      goto LAB_00d6dbf8;
    case 0x40:
      info = EmitGrowMemory(this);
      goto LAB_00d6dbec;
    case 0x41:
      pWVar8 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar8 == (WasmBinaryReader *)0x0) {
        pWVar8 = (this->m_module->m_reader).ptr;
      }
      WVar13 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.block;
      puVar10 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
      type = FirstLocalType;
      goto LAB_00d6eb4c;
    case 0x42:
      pWVar8 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar8 == (WasmBinaryReader *)0x0) {
        pWVar8 = (this->m_module->m_reader).ptr;
      }
      WVar13 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.block;
      puVar10 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
      type = I64;
      goto LAB_00d6eb4c;
    case 0x43:
      pWVar8 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar8 == (WasmBinaryReader *)0x0) {
        pWVar8 = (this->m_module->m_reader).ptr;
      }
      WVar13 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.block;
      puVar10 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
      type = F32;
      goto LAB_00d6eb4c;
    case 0x44:
      pWVar8 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar8 == (WasmBinaryReader *)0x0) {
        pWVar8 = (this->m_module->m_reader).ptr;
      }
      WVar13 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.block;
      puVar10 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
      type = F64;
LAB_00d6eb4c:
      cnst.field_0._8_8_ = puVar10;
      cnst.field_0.f64 = (double)WVar13;
      info = EmitConst(this,type,cnst);
      goto LAB_00d6dbec;
    case 0x45:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar14 = Eqz_Int;
      goto LAB_00d6db0d;
    case 0x46:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmEq_Int;
      break;
    case 0x47:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmNe_Int;
      break;
    case 0x48:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmLt_Int;
      break;
    case 0x49:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmLt_UInt;
      break;
    case 0x4a:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmGt_Int;
      break;
    case 0x4b:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmGt_UInt;
      break;
    case 0x4c:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmLe_Int;
      break;
    case 0x4d:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmLe_UInt;
      break;
    case 0x4e:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmGe_Int;
      break;
    case 0x4f:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = CmGe_UInt;
      break;
    case 0x50:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_L;
      OVar14 = Eqz_Long;
      goto LAB_00d6db0d;
    case 0x51:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmEq_Long;
      break;
    case 0x52:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmNe_Long;
      break;
    case 0x53:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmLt_Long;
      break;
    case 0x54:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmLt_ULong;
      break;
    case 0x55:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmGt_Long;
      break;
    case 0x56:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmGt_ULong;
      break;
    case 0x57:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmLe_Long;
      break;
    case 0x58:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmLe_ULong;
      break;
    case 0x59:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmGe_Long;
      break;
    case 0x5a:
      puVar11 = WasmOpCodeSignatures::I_LL;
      OVar14 = CmGe_ULong;
      break;
    case 0x5b:
      puVar11 = WasmOpCodeSignatures::I_FF;
      OVar14 = CmEq_Flt;
      break;
    case 0x5c:
      puVar11 = WasmOpCodeSignatures::I_FF;
      OVar14 = CmNe_Flt;
      break;
    case 0x5d:
      puVar11 = WasmOpCodeSignatures::I_FF;
      OVar14 = CmLt_Flt;
      break;
    case 0x5e:
      puVar11 = WasmOpCodeSignatures::I_FF;
      OVar14 = CmGt_Flt;
      break;
    case 0x5f:
      puVar11 = WasmOpCodeSignatures::I_FF;
      OVar14 = CmLe_Flt;
      break;
    case 0x60:
      puVar11 = WasmOpCodeSignatures::I_FF;
      OVar14 = CmGe_Flt;
      break;
    case 0x61:
      puVar11 = WasmOpCodeSignatures::I_DD;
      OVar14 = CmEq_Db;
      break;
    case 0x62:
      puVar11 = WasmOpCodeSignatures::I_DD;
      OVar14 = CmNe_Db;
      break;
    case 99:
      puVar11 = WasmOpCodeSignatures::I_DD;
      OVar14 = CmLt_Db;
      break;
    case 100:
      puVar11 = WasmOpCodeSignatures::I_DD;
      OVar14 = CmGt_Db;
      break;
    case 0x65:
      puVar11 = WasmOpCodeSignatures::I_DD;
      OVar14 = CmLe_Db;
      break;
    case 0x66:
      puVar11 = WasmOpCodeSignatures::I_DD;
      OVar14 = CmGe_Db;
      break;
    case 0x67:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar14 = Clz32_Int;
      goto LAB_00d6db0d;
    case 0x68:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar14 = Ctz_Int;
      goto LAB_00d6db0d;
    case 0x69:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
      OVar14 = PopCnt_Int;
      goto LAB_00d6db0d;
    case 0x6a:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Add_Int;
      break;
    case 0x6b:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Sub_Int;
      break;
    case 0x6c:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Mul_Int;
      break;
    case 0x6d:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Div_Trap_Int;
      break;
    case 0x6e:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Div_Trap_UInt;
      break;
    case 0x6f:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Rem_Trap_Int;
      break;
    case 0x70:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Rem_Trap_UInt;
      break;
    case 0x71:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = And_Int;
      break;
    case 0x72:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Or_Int;
      break;
    case 0x73:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Xor_Int;
      break;
    case 0x74:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Shl_Int;
      break;
    case 0x75:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Shr_Int;
      break;
    case 0x76:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Shr_UInt;
      break;
    case 0x77:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Rol_Int;
      break;
    case 0x78:
      puVar11 = WasmOpCodeSignatures::I_II;
      OVar14 = Ror_Int;
      break;
    case 0x79:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_L;
      OVar14 = Clz_Long;
      goto LAB_00d6db0d;
    case 0x7a:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_L;
      OVar14 = Ctz_Long;
      goto LAB_00d6db0d;
    case 0x7b:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_L;
      OVar14 = PopCnt_Long;
      goto LAB_00d6db0d;
    case 0x7c:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Add_Long;
      break;
    case 0x7d:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Sub_Long;
      break;
    case 0x7e:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Mul_Long;
      break;
    case 0x7f:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Div_Trap_Long;
      break;
    case 0x80:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Div_Trap_ULong;
      break;
    case 0x81:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Rem_Trap_Long;
      break;
    case 0x82:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Rem_Trap_ULong;
      break;
    case 0x83:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = And_Long;
      break;
    case 0x84:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Or_Long;
      break;
    case 0x85:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Xor_Long;
      break;
    case 0x86:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Shl_Long;
      break;
    case 0x87:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Shr_Long;
      break;
    case 0x88:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Shr_ULong;
      break;
    case 0x89:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Rol_Long;
      break;
    case 0x8a:
      puVar11 = WasmOpCodeSignatures::L_LL;
      OVar14 = Ror_Long;
      break;
    case 0x8b:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar14 = Abs_Flt;
      goto LAB_00d6db0d;
    case 0x8c:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar14 = Neg_Flt;
      goto LAB_00d6db0d;
    case 0x8d:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar14 = Ceil_Flt;
      goto LAB_00d6db0d;
    case 0x8e:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar14 = Floor_Flt;
      goto LAB_00d6db0d;
    case 0x8f:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar14 = Trunc_Flt;
      goto LAB_00d6db0d;
    case 0x90:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar14 = Nearest_Flt;
      goto LAB_00d6db0d;
    case 0x91:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_F;
      OVar14 = Sqrt_Flt;
      goto LAB_00d6db0d;
    case 0x92:
      puVar11 = WasmOpCodeSignatures::F_FF;
      OVar14 = Add_Flt;
      break;
    case 0x93:
      puVar11 = WasmOpCodeSignatures::F_FF;
      OVar14 = Sub_Flt;
      break;
    case 0x94:
      puVar11 = WasmOpCodeSignatures::F_FF;
      OVar14 = Mul_Flt;
      break;
    case 0x95:
      puVar11 = WasmOpCodeSignatures::F_FF;
      OVar14 = Div_Flt;
      break;
    case 0x96:
      puVar11 = WasmOpCodeSignatures::F_FF;
      OVar14 = Min_Flt;
      break;
    case 0x97:
      puVar11 = WasmOpCodeSignatures::F_FF;
      OVar14 = Max_Flt;
      break;
    case 0x98:
      puVar11 = WasmOpCodeSignatures::F_FF;
      OVar14 = Copysign_Flt;
      break;
    case 0x99:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar14 = Abs_Db;
      goto LAB_00d6db0d;
    case 0x9a:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar14 = Neg_Db;
      goto LAB_00d6db0d;
    case 0x9b:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar14 = Ceil_Db;
      goto LAB_00d6db0d;
    case 0x9c:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar14 = Floor_Db;
      goto LAB_00d6db0d;
    case 0x9d:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar14 = Trunc_Db;
      goto LAB_00d6db0d;
    case 0x9e:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar14 = Nearest_Db;
      goto LAB_00d6db0d;
    case 0x9f:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_D;
      OVar14 = Sqrt_Db;
      goto LAB_00d6db0d;
    case 0xa0:
      puVar11 = WasmOpCodeSignatures::D_DD;
      OVar14 = Add_Db;
      break;
    case 0xa1:
      puVar11 = WasmOpCodeSignatures::D_DD;
      OVar14 = Sub_Db;
      break;
    case 0xa2:
      puVar11 = WasmOpCodeSignatures::D_DD;
      OVar14 = Mul_Db;
      break;
    case 0xa3:
      puVar11 = WasmOpCodeSignatures::D_DD;
      OVar14 = Div_Db;
      break;
    case 0xa4:
      puVar11 = WasmOpCodeSignatures::D_DD;
      OVar14 = Min_Db;
      break;
    case 0xa5:
      puVar11 = WasmOpCodeSignatures::D_DD;
      OVar14 = Max_Db;
      break;
    case 0xa6:
      puVar11 = WasmOpCodeSignatures::D_DD;
      OVar14 = Copysign_Db;
      break;
    case 0xa7:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_L;
      OVar14 = Conv_LTI;
      goto LAB_00d6db0d;
    case 0xa8:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar14 = Conv_Check_FTI;
      goto LAB_00d6db0d;
    case 0xa9:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar14 = Conv_Check_FTU;
      goto LAB_00d6db0d;
    case 0xaa:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_D;
      OVar14 = Conv_Check_DTI;
      goto LAB_00d6db0d;
    case 0xab:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_D;
      OVar14 = Conv_Check_DTU;
      goto LAB_00d6db0d;
    case 0xac:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
      OVar14 = Conv_ITL;
      goto LAB_00d6db0d;
    case 0xad:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_I;
      OVar14 = Conv_UTL;
      goto LAB_00d6db0d;
    case 0xae:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_F;
      OVar14 = Conv_Check_FTL;
      goto LAB_00d6db0d;
    case 0xaf:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_F;
      OVar14 = Conv_Check_FTUL;
      goto LAB_00d6db0d;
    case 0xb0:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar14 = Conv_Check_DTL;
      goto LAB_00d6db0d;
    case 0xb1:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar14 = Conv_Check_DTUL;
      goto LAB_00d6db0d;
    case 0xb2:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_I;
      OVar14 = Fround_Int;
      goto LAB_00d6db0d;
    case 0xb3:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_I;
      OVar14 = Conv_UTF;
      goto LAB_00d6db0d;
    case 0xb4:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_L;
      OVar14 = Conv_LTF;
      goto LAB_00d6db0d;
    case 0xb5:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_L;
      OVar14 = Conv_ULTF;
      goto LAB_00d6db0d;
    case 0xb6:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_D;
      OVar14 = Fround_Db;
      goto LAB_00d6db0d;
    case 0xb7:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_I;
      OVar14 = Conv_ITD;
      goto LAB_00d6db0d;
    case 0xb8:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_I;
      OVar14 = Conv_UTD;
      goto LAB_00d6db0d;
    case 0xb9:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_L;
      OVar14 = Conv_LTD;
      goto LAB_00d6db0d;
    case 0xba:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_L;
      OVar14 = Conv_ULTD;
      goto LAB_00d6db0d;
    case 0xbb:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_F;
      OVar14 = Conv_FTD;
      goto LAB_00d6db0d;
    case 0xbc:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_F;
      OVar14 = Reinterpret_FTI;
      goto LAB_00d6db0d;
    case 0xbd:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_D;
      OVar14 = Reinterpret_DTL;
      goto LAB_00d6db0d;
    case 0xbe:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_I;
      OVar14 = Reinterpret_ITF;
      goto LAB_00d6db0d;
    case 0xbf:
      pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_L;
      OVar14 = Reinterpret_LTD;
LAB_00d6db0d:
      info = EmitUnaryExpr(this,OVar14,pWVar12);
      goto LAB_00d6dbec;
    case 0xc0:
      goto switchD_00d6dc8c_caseD_c0;
    case 0xc1:
      goto switchD_00d6dc8c_caseD_c1;
    case 0xc2:
      goto switchD_00d6dc8c_caseD_c2;
    case 0xc3:
      goto switchD_00d6dc8c_caseD_c3;
    case 0xc4:
      goto switchD_00d6dc8c_caseD_c4;
    default:
      switch(op) {
      case wbV128Load:
        OVar14 = Simd128_LdArr_F4;
        bVar2 = false;
        goto LAB_00d6dda0;
      case wbV128Load|wbNop:
      case wbV128Load|wbBlock:
      case wbV128Load|wbLoop:
      case wbV128Load|wbIf:
      case wbV128Load|wbElse:
      case wbV128Load|wbIf|wbBlock:
      case wbV128Load|wbIf|wbLoop:
      case 0xfd08:
      case 0xfd09:
      case 0xfd0a:
      case wbV128Const|wbBlock:
      case wbV128And|wbNop:
      case wbV128Bitselect|wbNop:
      case wbV128Or|wbIf:
      case wbV128Or|wbElse:
      case wbV128Or|wbIf|wbBlock:
      case wbV128Or|wbIf|wbLoop:
      case 0xfd58:
      case 0xfd59:
      case 0xfd5a:
      case wbV128Or|wbEnd:
      case wbV128Or|wbBr:
      case wbV128Or|wbBrIf:
      case wbV128Or|wbBrTable:
      case wbV128Or|wbReturn:
      case wbI4GeU|wbGetLocal:
      case wbI4GeU|wbSetGlobal:
      case wbI4GeU|wbSetGlobal|wbNop:
      case wbI4GeU|wbSetGlobal|wbBlock:
      case wbI4GeU|wbSetGlobal|wbLoop:
      case wbI4GeU|wbI32LoadMem:
      case wbI4GeU|wbI64LoadMem:
      case wbI4GeU|wbF32LoadMem:
      case wbI16AddSaturateU|wbIf:
      case wbI16AddSaturateU|wbElse:
      case wbI16AddSaturateU|wbIf|wbBlock:
      case wbI16AddSaturateU|wbIf|wbLoop:
      case 0xfd78:
      case 0xfd79:
      case 0xfd7a:
      case wbI16AddSaturateU|wbEnd:
      case wbI16AddSaturateU|wbBr:
      case wbI16AddSaturateU|wbBrIf:
      case wbI16AddSaturateU|wbBrTable:
      case wbI16AddSaturateU|wbReturn:
      case wbV128Load|wbI64DivU:
      case wbV128Load|wbI64Or:
      case wbV128Load|wbI64Xor:
      case wbV128Load|wbI64Shl:
      case wbV128Load|wbI64ShrS:
      case wbV128Load|wbI64ShrU:
      case wbV128Load|wbI64Rol:
      case wbV128Load|wbI64Ror:
      case wbI8AddSaturateU|wbIf:
      case wbI8AddSaturateU|wbIf|wbBlock:
      case wbI8AddSaturateU|wbIf|wbLoop:
      case 0xfd98:
      case 0xfd99:
      case 0xfd9a:
      case wbI8AddSaturateU|wbEnd:
      case wbI8AddSaturateU|wbBr:
      case wbI8AddSaturateU|wbBrIf:
      case wbI8AddSaturateU|wbBrTable:
      case wbI8AddSaturateU|wbReturn:
      case wbV128Load|wbF64Add:
      case wbV128Load|wbF64Min:
      case wbV128Load|wbF64Max:
      case wbV128Load|wbF64CopySign:
      case wbV128Load|wbI32Wrap_I64:
      case wbV128Load|wbI32TruncS_F32:
      case wbV128Load|wbI32TruncU_F32:
      case wbV128Load|wbI32TruncS_F64:
      case wbI4Add|wbNop:
      case wbV128Load|wbI64TruncS_F64:
      case wbV128Load|wbF32SConvertI32:
      case wbV128Load|wbF32UConvertI32:
      case wbV128Load|wbF32SConvertI64:
      case wbV128Load|wbF32DemoteF64:
      case wbV128Load|wbF64SConvertI32:
      case wbV128Load|wbF64UConvertI32:
      case wbV128Load|wbF64SConvertI64:
      case wbV128Load|wbF64UConvertI64:
      case wbV128Load|wbF64PromoteF32:
      case wbV128Load|wbI32ReinterpretF32:
      case wbV128Load|wbI64ReinterpretF64:
      case wbV128Load|wbF32ReinterpretI32:
      case wbV128Load|wbF64ReinterpretI64:
      case wbV128Load|wbI32Extend8_s:
      case wbV128Load|wbI64Extend8_s:
      case wbV128Load|wbI64Extend16_s:
      case wbV128Load|wbI64Extend32_s:
      case wbV128Load|wbI64Extend32_s|wbNop:
      case wbV128Load|wbI64Extend32_s|wbBlock:
      case wbV128Load|wbI64Extend32_s|wbLoop:
      case 0xfdc8:
      case 0xfdc9:
      case 0xfdca:
      case wbI2Add|wbNop:
      case wbV128Load|wbI32Extend8_s|wbCall:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBlock:
      case wbV128Load|wbI32Extend8_s|wbCall|wbLoop:
      case wbV128Load|wbI32Extend8_s|wbCall|wbIf:
      case wbV128Load|wbI32Extend8_s|wbCall|wbElse:
      case wbV128Load|wbI32Extend8_s|wbCall|wbIf|wbBlock:
      case wbV128Load|wbI32Extend8_s|wbCall|wbIf|wbLoop:
      case 0xfdd8:
      case 0xfdd9:
      case wbV128Load|wbI32Extend8_s|wbDrop:
      case wbV128Load|wbI32Extend8_s|wbSelect:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBr:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBrIf:
      case wbV128Load|wbI32Extend8_s|wbCall|wbBrTable:
      case wbV128Load|wbI32Extend8_s|wbCall|wbReturn:
      case wbF4Abs|wbBlock:
      case wbF4Min|wbBlock:
      case wbF4Min|wbLoop:
      case wbF2Abs|wbBlock:
      case wbF2Min|wbBlock:
      case wbF2Min|wbLoop:
        goto switchD_00d6dc8c_caseD_6;
      case wbV128Store:
        bVar2 = true;
        OVar14 = Simd128_StArr_F4;
LAB_00d6dda0:
        info = EmitSimdMemAccess(this,OVar14,(WasmType *)&WasmOpCodeSignatures::V128_I,TYPE_FLOAT32,
                                 '\x10',bVar2);
        goto LAB_00d6dbec;
      case wbV128Const:
        Simd::EnsureSimdIsEnabled();
        pWVar8 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
        if (pWVar8 == (WasmBinaryReader *)0x0) {
          pWVar8 = (this->m_module->m_reader).ptr;
        }
        WVar13 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.block;
        puVar10 = (pWVar8->super_WasmReaderBase).m_currentNode.field_1.brTable.targetTable;
        type = V128;
        goto LAB_00d6eb4c;
      case wbV8X16Shuffle:
        Simd::EnsureSimdIsEnabled();
        info = EmitV8X16Shuffle(this);
        goto LAB_00d6dbec;
      case wbI16Splat:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar14 = Simd128_Splat_I16;
        goto LAB_00d6db0d;
      case wbI8Splat:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar14 = Simd128_Splat_I8;
        goto LAB_00d6db0d;
      case wbI4Splat:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar14 = Simd128_Splat_I4;
        goto LAB_00d6db0d;
      case wbI2Splat:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_L;
        OVar14 = Simd128_Splat_I2;
        goto LAB_00d6db0d;
      case wbF4Splat:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_F;
        OVar14 = Simd128_Splat_F4;
        goto LAB_00d6db0d;
      case wbF2Splat:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_D;
        OVar14 = Simd128_Splat_D2;
        goto LAB_00d6db0d;
      case wbI16ExtractLaneS:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_ExtractLane_I16;
        goto LAB_00d6f084;
      case wbI16ExtractLaneU:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_ExtractLane_U16;
        goto LAB_00d6f084;
      case wbI16ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar14 = Simd128_ReplaceLane_I16;
        goto LAB_00d6f0ff;
      case wbI8ExtractLaneS:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_ExtractLane_I8;
        goto LAB_00d6f084;
      case wbI8ExtractLaneU:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_ExtractLane_U8;
        goto LAB_00d6f084;
      case wbI8ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar14 = Simd128_ReplaceLane_I8;
        goto LAB_00d6f0ff;
      case wbI4ExtractLane:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_ExtractLane_I4;
        goto LAB_00d6f084;
      case wbI4ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_I;
        OVar14 = Simd128_ReplaceLane_I4;
        goto LAB_00d6f0ff;
      case wbI2ExtractLane:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_V128;
        OVar14 = Simd128_ExtractLane_I2;
        goto LAB_00d6f084;
      case wbI2ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_L;
        OVar14 = Simd128_ReplaceLane_I2;
        goto LAB_00d6f0ff;
      case wbF4ExtractLane:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_V128;
        OVar14 = Simd128_ExtractLane_F4;
LAB_00d6f084:
        info = EmitExtractLaneExpr(this,OVar14,pWVar12);
        goto LAB_00d6dbec;
      case wbF4ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_F;
        OVar14 = Simd128_ReplaceLane_F4;
        goto LAB_00d6f0ff;
      case wbF2ExtractLane:
        puVar11 = WasmOpCodeSignatures::D_V128_I;
        OVar14 = Simd128_ExtractLane_D2;
        break;
      case wbF2ReplaceLane:
        Simd::EnsureSimdIsEnabled();
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_D;
        OVar14 = Simd128_ReplaceLane_D2;
LAB_00d6f0ff:
        info = EmitReplaceLaneExpr(this,OVar14,pWVar12);
        goto LAB_00d6dbec;
      case wbI16Eq:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Eq_I16;
        break;
      case wbI16Ne:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Neq_I16;
        break;
      case wbI16LtS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Lt_I16;
        break;
      case wbI16LtU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Lt_U16;
        break;
      case wbI16GtS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Gt_I16;
        break;
      case wbI16GtU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Gt_U16;
        break;
      case wbI16LeS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_LtEq_I16;
        break;
      case wbI16LeU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_LtEq_U16;
        break;
      case wbI16GeS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_GtEq_I16;
        break;
      case wbI16GeU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_GtEq_U16;
        break;
      case wbI8Eq:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Eq_I8;
        break;
      case wbI8Ne:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Neq_I8;
        break;
      case wbI8LtS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Lt_I8;
        break;
      case wbI8LtU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Lt_U8;
        break;
      case wbI8GtS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Gt_I8;
        break;
      case wbI8GtU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Gt_U8;
        break;
      case wbI8LeS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_LtEq_I8;
        break;
      case wbI8LeU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_LtEq_U8;
        break;
      case wbI8GeS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_GtEq_I8;
        break;
      case wbI8GeU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_GtEq_U8;
        break;
      case wbI4Eq:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Eq_I4;
        break;
      case wbI4Ne:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Neq_I4;
        break;
      case wbI4LtS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Lt_I4;
        break;
      case wbI4LtU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Lt_U4;
        break;
      case wbI4GtS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Gt_I4;
        break;
      case wbI4GtU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Gt_U4;
        break;
      case wbI4LeS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_LtEq_I4;
        break;
      case wbI4LeU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_LtEq_U4;
        break;
      case wbI4GeS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_GtEq_I4;
        break;
      case wbI4GeU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_GtEq_U4;
        break;
      case wbF4Eq:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Eq_F4;
        break;
      case wbF4Ne:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Neq_F4;
        break;
      case wbF4Lt:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Lt_F4;
        break;
      case wbF4Gt:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Gt_F4;
        break;
      case wbF4Le:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_LtEq_F4;
        break;
      case wbF4Ge:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_GtEq_F4;
        break;
      case wbF2Eq:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Eq_D2;
        break;
      case wbF2Ne:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Neq_D2;
        break;
      case wbF2Lt:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Lt_D2;
        break;
      case wbF2Gt:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Gt_D2;
        break;
      case wbF2Le:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_LtEq_D2;
        break;
      case wbF2Ge:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_GtEq_D2;
        break;
      case wbV128Not:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Not_I4;
        goto LAB_00d6db0d;
      case wbV128And:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_And_I4;
        break;
      case wbV128Or:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Or_I4;
        break;
      case wbV128Xor:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Xor_I4;
        break;
      case wbV128Bitselect:
        Simd::EnsureSimdIsEnabled();
        info = EmitV128BitSelect(this);
        goto LAB_00d6dbec;
      case wbI16Neg:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Neg_I16;
        goto LAB_00d6db0d;
      case wbI16AnyTrue:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_AnyTrue_B16;
        goto LAB_00d6db0d;
      case wbI16AllTrue:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_AllTrue_B16;
        goto LAB_00d6db0d;
      case wbI16Shl:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShLtByScalar_I16;
        break;
      case wbI16ShrS:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShRtByScalar_I16;
        break;
      case wbI16ShrU:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShRtByScalar_U16;
        break;
      case wbI16Add:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Add_I16;
        break;
      case wbI16AddSaturateS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_AddSaturate_I16;
        break;
      case wbI16AddSaturateU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_AddSaturate_U16;
        break;
      case wbI16Sub:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Sub_I16;
        break;
      case wbI16SubSaturateS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_SubSaturate_I16;
        break;
      case wbI16SubSaturateU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_SubSaturate_U16;
        break;
      case wbI8Neg:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Neg_I8;
        goto LAB_00d6db0d;
      case wbI8AnyTrue:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_AnyTrue_B8;
        goto LAB_00d6db0d;
      case wbI8AllTrue:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_AllTrue_B8;
        goto LAB_00d6db0d;
      case wbI8Shl:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShLtByScalar_I8;
        break;
      case wbI8ShrS:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShRtByScalar_I8;
        break;
      case wbI8ShrU:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShRtByScalar_U8;
        break;
      case wbI8Add:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Add_I8;
        break;
      case wbI8AddSaturateS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_AddSaturate_I8;
        break;
      case wbI8AddSaturateU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_AddSaturate_U8;
        break;
      case wbI8Sub:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Sub_I8;
        break;
      case wbI8SubSaturateS:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_SubSaturate_I8;
        break;
      case wbI8SubSaturateU:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_SubSaturate_U8;
        break;
      case wbI8Mul:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Mul_I8;
        break;
      case wbI4Neg:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Neg_I4;
        goto LAB_00d6db0d;
      case wbI4AnyTrue:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_AnyTrue_B4;
        goto LAB_00d6db0d;
      case wbI4AllTrue:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_V128;
        OVar14 = Simd128_AllTrue_B4;
        goto LAB_00d6db0d;
      case wbI4Shl:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShLtByScalar_I4;
        break;
      case wbI4ShrS:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShRtByScalar_I4;
        break;
      case wbI4ShrU:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShRtByScalar_U4;
        break;
      case wbI4Add:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Add_I4;
        break;
      case wbI4Sub:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Sub_I4;
        break;
      case wbI4Mul:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Mul_I4;
        break;
      case wbI2Neg:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Neg_I2;
        goto LAB_00d6db0d;
      case wbI2Shl:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShLtByScalar_I2;
        break;
      case wbI2ShrS:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShRtByScalar_I2;
        break;
      case wbI2ShrU:
        puVar11 = WasmOpCodeSignatures::V128_V128_I;
        OVar14 = Simd128_ShRtByScalar_U2;
        break;
      case wbI2Add:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Add_I2;
        break;
      case wbI2Sub:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Sub_I2;
        break;
      case wbF4Abs:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Abs_F4;
        goto LAB_00d6db0d;
      case wbF4Neg:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Neg_F4;
        goto LAB_00d6db0d;
      case wbF4Sqrt:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Sqrt_F4;
        goto LAB_00d6db0d;
      case wbF4Add:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Add_F4;
        break;
      case wbF4Sub:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Sub_F4;
        break;
      case wbF4Mul:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Mul_F4;
        break;
      case wbF4Div:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Div_F4;
        break;
      case wbF4Min:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Min_F4;
        break;
      case wbF4Max:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Max_F4;
        break;
      case wbF2Abs:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Abs_D2;
        goto LAB_00d6db0d;
      case wbF2Neg:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Neg_D2;
        goto LAB_00d6db0d;
      case wbF2Sqrt:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_Sqrt_D2;
        goto LAB_00d6db0d;
      case wbF2Add:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Add_D2;
        break;
      case wbF2Sub:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Sub_D2;
        break;
      case wbF2Mul:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Mul_D2;
        break;
      case wbF2Div:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Div_D2;
        break;
      case wbF2Min:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Min_D2;
        break;
      case wbF2Max:
        puVar11 = WasmOpCodeSignatures::V128X3;
        OVar14 = Simd128_Max_D2;
        break;
      case wbI4TruncS:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_FromFloat32x4_I4;
        goto LAB_00d6db0d;
      case wbI4TruncU:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_FromFloat32x4_U4;
        goto LAB_00d6db0d;
      case wbF4ConvertS:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_FromInt32x4_F4;
        goto LAB_00d6db0d;
      case wbF4ConvertU:
        pWVar12 = (WasmType *)&WasmOpCodeSignatures::V128_V128;
        OVar14 = Simd128_FromUint32x4_F4;
        goto LAB_00d6db0d;
      default:
        switch(op) {
        case wbPrintFuncName:
          pWVar12 = (WasmType *)&WasmOpCodeSignatures::V_I;
          OVar14 = PrintFuncName;
          break;
        case wbPrintArgSeparator:
          pIVar17 = this->m_writer;
          pp_Var7 = pIVar17->_vptr_IWasmByteCodeWriter;
          uVar16 = 0x11d;
          goto LAB_00d6df70;
        case wbPrintBeginCall:
          pIVar17 = this->m_writer;
          pp_Var7 = pIVar17->_vptr_IWasmByteCodeWriter;
          uVar16 = 0x11e;
          goto LAB_00d6df70;
        case wbPrintNewLine:
          pIVar17 = this->m_writer;
          pp_Var7 = pIVar17->_vptr_IWasmByteCodeWriter;
          uVar16 = 0x11f;
LAB_00d6df70:
          (*pp_Var7[7])(pIVar17,uVar16);
          local_38.count = 0;
          local_38.field_1.infos = (EmitInfo *)0x0;
          goto LAB_00d6dbf8;
        case wbPrintEndCall:
          pWVar12 = (WasmType *)&WasmOpCodeSignatures::V_I;
          OVar14 = PrintEndCall;
          break;
        case wbPrintEndCall|wbNop:
        case wbPrintEndCall|wbBlock:
        case wbPrintEndCall|wbLoop:
        case 0xf008:
        case 0xf009:
        case 0xf00a:
        case wbPrintFuncName|wbEnd:
          goto switchD_00d6dc8c_caseD_6;
        case wbPrintI32:
          pWVar12 = (WasmType *)&WasmOpCodeSignatures::I_I;
          OVar14 = PrintI32;
          break;
        case wbPrintI64:
          pWVar12 = (WasmType *)&WasmOpCodeSignatures::L_L;
          OVar14 = PrintI64;
          break;
        case wbPrintF32:
          pWVar12 = (WasmType *)&WasmOpCodeSignatures::F_F;
          OVar14 = PrintF32;
          break;
        case wbPrintF64:
          pWVar12 = (WasmType *)&WasmOpCodeSignatures::D_D;
          OVar14 = PrintF64;
          break;
        default:
          switch(iVar5) {
          case 0:
            goto switchD_00d6dd34_caseD_0;
          case 1:
            goto switchD_00d6dd34_caseD_1;
          case 2:
            goto switchD_00d6dd34_caseD_2;
          case 3:
            goto switchD_00d6dd34_caseD_3;
          case 4:
            goto switchD_00d6dd34_caseD_4;
          case 5:
            goto switchD_00d6dd34_caseD_5;
          case 6:
            goto switchD_00d6dd34_caseD_6;
          case 7:
            goto switchD_00d6dd34_caseD_7;
          }
          goto switchD_00d6dc8c_caseD_6;
        }
        goto LAB_00d6db0d;
      }
    }
    info = EmitBinExpr(this,OVar14,(WasmType *)puVar11);
LAB_00d6dbec:
    PolymorphicEmitInfo::PolymorphicEmitInfo(&local_38,info);
LAB_00d6dbf8:
    PVar18._4_4_ = 0;
    PVar18.count = local_38.count;
    PVar18.field_1.singleInfo = local_38.field_1.singleInfo;
    PushEvalStack(this,PVar18);
    pFVar1 = (this->m_funcInfo->m_body).ptr;
    if (pFVar1 == (FunctionBody *)0x0) {
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmBytecodePhase);
    }
    else {
      uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar1);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->m_funcInfo->m_body).ptr)
      ;
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmBytecodePhase,uVar3,LVar4);
    }
    if (bVar2 != false) {
      PrintOpEnd(this);
    }
switchD_00d6dc8c_caseD_1:
    return;
  }
LAB_00d700b3:
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
switchD_00d6dc8c_caseD_6:
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,L"Unknown expression\'s op 0x%X",(ulong)op);
  goto LAB_00d700b3;
}

Assistant:

void WasmBytecodeGenerator::EmitExpr(WasmOp op)
{
    DebugPrintOp(op);
    switch (op)
    {
#define WASM_OPCODE(opname, opcode, sig, imp, wat) \
    case opcode: \
        if (!imp) throw WasmCompilationException(_u("Operator %s is Not Yet Implemented"), _u(wat)); break;
#include "WasmBinaryOpCodes.h"
    default:
        break;
    }

    PolymorphicEmitInfo info;
    switch (op)
    {
    case wbGetGlobal:
        info = EmitGetGlobal();
        break;
    case wbSetGlobal:
        info = EmitSetGlobal();
        break;
    case wbGetLocal:
        info = EmitGetLocal();
        break;
    case wbSetLocal:
        info = EmitSetLocal(false);
        break;
    case wbTeeLocal:
        info = EmitSetLocal(true);
        break;
    case wbReturn:
        EmitReturnExpr();
        info = EmitInfo(WasmTypes::Any);
        break;
    case wbF32Const:
        info = EmitConst(WasmTypes::F32, GetReader()->m_currentNode.cnst);
        break;
    case wbF64Const:
        info = EmitConst(WasmTypes::F64, GetReader()->m_currentNode.cnst);
        break;
    case wbI32Const:
        info = EmitConst(WasmTypes::I32, GetReader()->m_currentNode.cnst);
        break;
    case wbI64Const:
        info = EmitConst(WasmTypes::I64, GetReader()->m_currentNode.cnst);
        break;
#ifdef ENABLE_WASM_SIMD
    case wbV128Const:
        Simd::EnsureSimdIsEnabled();
        info = EmitConst(WasmTypes::V128, GetReader()->m_currentNode.cnst);
        break;
#endif
    case wbBlock:
        info = EmitBlock();
        break;
    case wbLoop:
        info = EmitLoop();
        break;
    case wbCall:
        info = EmitCall<wbCall>();
        break;
    case wbCallIndirect:
        info = EmitCall<wbCallIndirect>();
        break;
    case wbIf:
        info = EmitIfElseExpr();
        break;
    case wbElse:
        throw WasmCompilationException(_u("Unexpected else opcode"));
    case wbEnd:
        throw WasmCompilationException(_u("Unexpected end opcode"));
    case wbBr:
        EmitBr();
        info = EmitInfo(WasmTypes::Any);
        break;
    case wbBrIf:
        info = EmitBrIf();
        break;
    case wbSelect:
        info = EmitSelect();
        break;
    case wbBrTable:
        EmitBrTable();
        info = EmitInfo(WasmTypes::Any);
        break;
    case wbDrop:
        info = EmitDrop();
        break;
    case wbNop:
        return;
    case wbMemorySize:
    {
        SetUsesMemory(0);
        Js::RegSlot tempReg = GetRegisterSpace(WasmTypes::I32)->AcquireTmpRegister();
        info = EmitInfo(tempReg, WasmTypes::I32);
        m_writer->AsmReg1(Js::OpCodeAsmJs::MemorySize_Int, tempReg);
        break;
    }
    case wbMemoryGrow:
    {
        info = EmitGrowMemory();
        break;
    }
    case wbUnreachable:
        m_writer->EmptyAsm(Js::OpCodeAsmJs::Unreachable_Void);
        SetUnreachableState(true);
        info = EmitInfo(WasmTypes::Any);
        break;
#ifdef ENABLE_WASM_SIMD
    case wbV128Bitselect:
        Simd::EnsureSimdIsEnabled();
        info = EmitV128BitSelect();
        break;
    case wbV8X16Shuffle:
        Simd::EnsureSimdIsEnabled();
        info = EmitV8X16Shuffle();
        break;
#define WASM_EXTRACTLANE_OPCODE(opname, opcode, sig, asmjsop, ...) \
    case wb##opname: \
        Simd::EnsureSimdIsEnabled();\
        info = EmitExtractLaneExpr(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig); \
        break;
#define WASM_REPLACELANE_OPCODE(opname, opcode, sig, asmjsop, ...) \
    case wb##opname: \
        Simd::EnsureSimdIsEnabled();\
        info = EmitReplaceLaneExpr(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig); \
        break;
#endif
#define WASM_MEMREAD_OPCODE(opname, opcode, sig, imp, viewtype, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitMemAccess<false, false>(wb##opname, WasmOpCodeSignatures::sig, viewtype); \
        break;
#define WASM_ATOMICREAD_OPCODE(opname, opcode, sig, imp, viewtype, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitMemAccess<false, true>(wb##opname, WasmOpCodeSignatures::sig, viewtype); \
        break;
#define WASM_MEMSTORE_OPCODE(opname, opcode, sig, imp, viewtype, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitMemAccess<true, false>(wb##opname, WasmOpCodeSignatures::sig, viewtype); \
        break;
#define WASM_ATOMICSTORE_OPCODE(opname, opcode, sig, imp, viewtype, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitMemAccess<true, true>(wb##opname, WasmOpCodeSignatures::sig, viewtype); \
        break;
#define WASM_SIMD_MEMREAD_OPCODE(opname, opcode, sig, asmjsop, viewtype, dataWidth, ...) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitSimdMemAccess(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig, viewtype, dataWidth, false); \
        break;
#define WASM_SIMD_MEMSTORE_OPCODE(opname, opcode, sig, asmjsop, viewtype, dataWidth, ...) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig > 0);\
        info = EmitSimdMemAccess(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig, viewtype, dataWidth, true); \
        break;
#define WASM_BINARY_OPCODE(opname, opcode, sig, asmjsop, imp, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig == 3);\
        info = EmitBinExpr(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig); \
        break;
#define WASM_UNARY__OPCODE(opname, opcode, sig, asmjsop, imp, wat) \
    case wb##opname: \
        Assert(WasmOpCodeSignatures::n##sig == 2);\
        info = EmitUnaryExpr(Js::OpCodeAsmJs::##asmjsop, WasmOpCodeSignatures::sig); \
        break;
#define WASM_EMPTY__OPCODE(opname, opcode, asmjsop, imp, wat) \
    case wb##opname: \
        m_writer->EmptyAsm(Js::OpCodeAsmJs::##asmjsop);\
        break;
#include "WasmBinaryOpCodes.h"
    default:
        throw WasmCompilationException(_u("Unknown expression's op 0x%X"), op);
    }

    PushEvalStack(info);
    DebugPrintOpEnd();
}